

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::RestoreState(FunctionBody *this,ParseNodeFnc *pnodeFnc)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  char16 *pcVar5;
  char16 *pcVar6;
  wchar local_78 [4];
  char16 debugStringBuffer [42];
  ParseNodeFnc *pnodeFnc_local;
  FunctionBody *this_local;
  
  bVar2 = ParseableFunctionInfo::IsReparsed(&this->super_ParseableFunctionInfo);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xc3b,"(this->IsReparsed())","this->IsReparsed()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = ParseNodeFnc::ChildCallsEval(pnodeFnc);
  bVar3 = GetChildCallsEval(this);
  if ((bVar2 != bVar3) && ((DAT_01ec73ca & 1) != 0)) {
    pcVar5 = ParseableFunctionInfo::GetExternalDisplayName(&this->super_ParseableFunctionInfo);
    pcVar6 = FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_78);
    Output::Trace(DebuggerPhase,L"Child calls eval is different on debug reparse: %s(%s)\n",pcVar5,
                  pcVar6);
  }
  bVar2 = ParseNodeFnc::CallsEval(pnodeFnc);
  bVar3 = GetCallsEval(this);
  if ((bVar2 != bVar3) && ((DAT_01ec73ca & 1) != 0)) {
    pcVar5 = ParseableFunctionInfo::GetExternalDisplayName(&this->super_ParseableFunctionInfo);
    pcVar6 = FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_78);
    Output::Trace(DebuggerPhase,L"Calls eval is different on debug reparse: %s(%s)\n",pcVar5,pcVar6)
    ;
  }
  bVar2 = ParseNodeFnc::HasReferenceableBuiltInArguments(pnodeFnc);
  bVar3 = HasReferenceableBuiltInArguments(this);
  if ((bVar2 != bVar3) && ((DAT_01ec73ca & 1) != 0)) {
    pcVar5 = ParseableFunctionInfo::GetExternalDisplayName(&this->super_ParseableFunctionInfo);
    pcVar6 = FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_78);
    Output::Trace(DebuggerPhase,
                  L"Referenceable Built in args is different on debug reparse: %s(%s)\n",pcVar5,
                  pcVar6);
  }
  bVar2 = GetChildCallsEval(this);
  ParseNodeFnc::SetChildCallsEval(pnodeFnc,bVar2);
  bVar2 = GetCallsEval(this);
  ParseNodeFnc::SetCallsEval(pnodeFnc,bVar2);
  bVar2 = HasReferenceableBuiltInArguments(this);
  ParseNodeFnc::SetHasReferenceableBuiltInArguments(pnodeFnc,bVar2);
  return;
}

Assistant:

void FunctionBody::RestoreState(ParseNodeFnc * pnodeFnc)
    {
        Assert(this->IsReparsed());
#if ENABLE_DEBUG_CONFIG_OPTIONS
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
        if(!!pnodeFnc->ChildCallsEval() != this->GetChildCallsEval())
        {
            OUTPUT_VERBOSE_TRACE(Js::DebuggerPhase, _u("Child calls eval is different on debug reparse: %s(%s)\n"), this->GetExternalDisplayName(), this->GetDebugNumberSet(debugStringBuffer));
        }
        if(!!pnodeFnc->CallsEval() != this->GetCallsEval())
        {
            OUTPUT_VERBOSE_TRACE(Js::DebuggerPhase, _u("Calls eval is different on debug reparse: %s(%s)\n"), this->GetExternalDisplayName(), this->GetDebugNumberSet(debugStringBuffer));
        }
        if(!!pnodeFnc->HasReferenceableBuiltInArguments() != this->HasReferenceableBuiltInArguments())
        {
            OUTPUT_VERBOSE_TRACE(Js::DebuggerPhase, _u("Referenceable Built in args is different on debug reparse: %s(%s)\n"), this->GetExternalDisplayName(), this->GetDebugNumberSet(debugStringBuffer));
        }

        pnodeFnc->SetChildCallsEval(this->GetChildCallsEval());
        pnodeFnc->SetCallsEval(this->GetCallsEval());
        pnodeFnc->SetHasReferenceableBuiltInArguments(this->HasReferenceableBuiltInArguments());
    }